

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::IntegerFunctionTestInstance::~IntegerFunctionTestInstance
          (IntegerFunctionTestInstance *this)

{
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__IntegerFunctionTestInstance_00c0daa0;
  de::details::
  UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniqueBase(&(this->m_executor).
                 super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
               );
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_failMsg);
  ShaderSpec::~ShaderSpec(&this->m_spec);
  return;
}

Assistant:

IntegerFunctionTestInstance		(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
									: TestInstance	(context)
									, m_shaderType	(shaderType)
									, m_spec		(spec)
									, m_numValues	(numValues)
									, m_name		(name)
									, m_executor	(createExecutor(context, m_shaderType, m_spec))
								{
								}